

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_format_rar_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  uint *puVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  int iVar6;
  int *piVar7;
  void *pp;
  ulong uVar8;
  archive_entry *in_RSI;
  archive *in_RDI;
  unsigned_long crc32_val;
  uint flags;
  int ret;
  char head_type;
  size_t skip;
  rar *rar;
  char *p;
  void *h;
  char in_stack_0000008f;
  archive_entry *in_stack_00000090;
  archive_read *in_stack_00000098;
  ulong in_stack_ffffffffffffff98;
  archive_read *in_stack_ffffffffffffffa0;
  archive_read *in_stack_ffffffffffffffc8;
  void *local_28;
  int local_4;
  
  in_RDI->archive_format = 0xd0000;
  if (in_RDI->archive_format_name == (char *)0x0) {
    in_RDI->archive_format_name = "RAR";
  }
  puVar2 = *(uint **)in_RDI[0x15].archive_format_name;
  if (puVar2[0x13ba] == 0xffffffff) {
    puVar2[0x13ba] = 0;
  }
  piVar7 = (int *)__archive_read_ahead
                            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(ssize_t *)0x15a33a
                            );
  if (piVar7 == (int *)0x0) {
    local_4 = 1;
  }
  else if (((puVar2[0x3c] != 0) ||
           ((((char)*piVar7 != 'M' || (*(char *)((long)piVar7 + 1) != 'Z')) &&
            (*piVar7 != 0x464c457f)))) ||
          (local_4 = skip_sfx(in_stack_ffffffffffffffc8), -0x15 < local_4)) {
    puVar2[0x3c] = 1;
    do {
      local_28 = __archive_read_ahead
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(ssize_t *)0x15a3e2)
      ;
      if (local_28 == (void *)0x0) {
        return -0x1e;
      }
      cVar1 = *(char *)((long)local_28 + 2);
      switch(cVar1) {
      case 'r':
        iVar6 = memcmp(local_28,"Rar!\x1a\a",7);
        if (iVar6 != 0) {
          archive_set_error(in_RDI,0x54,"Invalid marker header");
          return -0x1e;
        }
        __archive_read_consume(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        break;
      case 's':
        uVar3 = archive_le16dec((void *)((long)local_28 + 3));
        *puVar2 = (uint)uVar3;
        uVar3 = archive_le16dec((void *)((long)local_28 + 5));
        uVar8 = (ulong)uVar3;
        if (uVar8 < 0xd) {
          archive_set_error(in_RDI,0x54,"Invalid header size");
          return -0x1e;
        }
        pp = __archive_read_ahead
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(ssize_t *)0x15a4ff);
        if (pp == (void *)0x0) {
          return -0x1e;
        }
        *(undefined2 *)(puVar2 + 4) = *(undefined2 *)((long)pp + 7);
        *(undefined4 *)((long)puVar2 + 0x12) = *(undefined4 *)((long)pp + 9);
        if ((*puVar2 & 0x200) != 0) {
          if (uVar8 < 0xe) {
            archive_set_error(in_RDI,0x54,"Invalid header size");
            return -0x1e;
          }
          *(undefined1 *)((long)puVar2 + 0x16) = *(undefined1 *)((long)pp + 0xd);
        }
        if ((*puVar2 & 0x80) != 0) {
          archive_entry_set_is_metadata_encrypted(in_RSI,'\x01');
          archive_entry_set_is_data_encrypted(in_RSI,'\x01');
          puVar2[0x13ba] = 1;
          archive_set_error(in_RDI,0x54,"RAR encryption support unavailable.");
          return -0x1e;
        }
        uVar8 = crc32(0,(long)pp + 2,(int)uVar8 + -2);
        in_stack_ffffffffffffffa0 = (archive_read *)(uVar8 & 0xffff);
        uVar3 = archive_le16dec(pp);
        if (in_stack_ffffffffffffffa0 != (archive_read *)(ulong)uVar3) {
          archive_set_error(in_RDI,0x54,"Header CRC error");
          return -0x1e;
        }
        __archive_read_consume(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        break;
      case 't':
        iVar6 = read_header(in_stack_00000098,in_stack_00000090,in_stack_0000008f);
        return iVar6;
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case '{':
        uVar3 = archive_le16dec((void *)((long)local_28 + 3));
        uVar4 = archive_le16dec((void *)((long)local_28 + 5));
        uVar8 = (ulong)uVar4;
        if (uVar8 < 7) {
          archive_set_error(in_RDI,0x54,"Invalid header size");
          return -0x1e;
        }
        if ((7 < uVar8) &&
           (local_28 = __archive_read_ahead
                                 (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                  (ssize_t *)0x15a708), local_28 == (void *)0x0)) {
          return -0x1e;
        }
        if ((uVar3 & 0x8000) != 0) {
          if (uVar8 < 0xb) {
            archive_set_error(in_RDI,0x54,"Invalid header size");
            return -0x1e;
          }
          uVar5 = archive_le32dec((void *)((long)local_28 + 7));
          uVar8 = uVar5 + uVar8;
          local_28 = __archive_read_ahead
                               (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                (ssize_t *)0x15a792);
          if (local_28 == (void *)0x0) {
            return -0x1e;
          }
        }
        uVar8 = crc32(0,(long)local_28 + 2,(int)uVar8 + -2);
        in_stack_ffffffffffffff98 = uVar8 & 0xffff;
        uVar3 = archive_le16dec(local_28);
        if (in_stack_ffffffffffffff98 != uVar3) {
          archive_set_error(in_RDI,0x54,"Header CRC error");
          return -0x1e;
        }
        __archive_read_consume(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        if (cVar1 == '{') {
          return 1;
        }
        break;
      case 'z':
        iVar6 = read_header(in_stack_00000098,in_stack_00000090,in_stack_0000008f);
        if (iVar6 < -0x14) {
          return iVar6;
        }
        break;
      default:
        archive_set_error(in_RDI,0x54,"Bad RAR file");
        return -0x1e;
      }
    } while( true );
  }
  return local_4;
}

Assistant:

static int
archive_read_format_rar_read_header(struct archive_read *a,
                                    struct archive_entry *entry)
{
  const void *h;
  const char *p;
  struct rar *rar;
  size_t skip;
  char head_type;
  int ret;
  unsigned flags;

  a->archive.archive_format = ARCHIVE_FORMAT_RAR;
  if (a->archive.archive_format_name == NULL)
    a->archive.archive_format_name = "RAR";

  rar = (struct rar *)(a->format->data);

  /*
   * It should be sufficient to call archive_read_next_header() for
   * a reader to determine if an entry is encrypted or not. If the
   * encryption of an entry is only detectable when calling
   * archive_read_data(), so be it. We'll do the same check there
   * as well.
   */
  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  /* RAR files can be generated without EOF headers, so return ARCHIVE_EOF if
  * this fails.
  */
  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_EOF);

  p = h;
  if (rar->found_first_header == 0 &&
     ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)) {
    /* This is an executable ? Must be self-extracting... */
    ret = skip_sfx(a);
    if (ret < ARCHIVE_WARN)
      return (ret);
  }
  rar->found_first_header = 1;

  while (1)
  {
    unsigned long crc32_val;

    if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
      return (ARCHIVE_FATAL);
    p = h;

    head_type = p[2];
    switch(head_type)
    {
    case MARK_HEAD:
      if (memcmp(p, RAR_SIGNATURE, 7) != 0) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid marker header");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, 7);
      break;

    case MAIN_HEAD:
      rar->main_flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
        return (ARCHIVE_FATAL);
      p = h;
      memcpy(rar->reserved1, p + 7, sizeof(rar->reserved1));
      memcpy(rar->reserved2, p + 7 + sizeof(rar->reserved1),
             sizeof(rar->reserved2));
      if (rar->main_flags & MHD_ENCRYPTVER) {
        if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)+1) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        rar->encryptver = *(p + 7 + sizeof(rar->reserved1) +
                            sizeof(rar->reserved2));
      }

      /* Main header is password encrytped, so we cannot read any
         file names or any other info about files from the header. */
      if (rar->main_flags & MHD_PASSWORD)
      {
        archive_entry_set_is_metadata_encrypted(entry, 1);
        archive_entry_set_is_data_encrypted(entry, 1);
        rar->has_encrypted_entries = 1;
         archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "RAR encryption support unavailable.");
        return (ARCHIVE_FATAL);
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      break;

    case FILE_HEAD:
      return read_header(a, entry, head_type);

    case COMM_HEAD:
    case AV_HEAD:
    case SUB_HEAD:
    case PROTECT_HEAD:
    case SIGN_HEAD:
    case ENDARC_HEAD:
      flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if (skip > 7) {
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
      }
      if (flags & HD_ADD_SIZE_PRESENT)
      {
        if (skip < 7 + 4) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        skip += archive_le32dec(p + 7);
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      if (head_type == ENDARC_HEAD)
        return (ARCHIVE_EOF);
      break;

    case NEWSUB_HEAD:
      if ((ret = read_header(a, entry, head_type)) < ARCHIVE_WARN)
        return ret;
      break;

    default:
      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file");
      return (ARCHIVE_FATAL);
    }
  }
}